

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_rust_punycode.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::anon_unknown_0::ScanNextDelta
               (char **punycode_begin,char *punycode_end,uint32_t bias,uint32_t *i)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  uint local_4c;
  uint32_t t;
  uint64_t new_i;
  int digit_value;
  uint32_t k;
  uint64_t w;
  uint32_t *i_local;
  uint32_t bias_local;
  char *punycode_end_local;
  char **punycode_begin_local;
  
  _digit_value = 1;
  new_i._4_4_ = 0x24;
  while( true ) {
    if (*punycode_begin == punycode_end) {
      return false;
    }
    pcVar1 = *punycode_begin;
    *punycode_begin = pcVar1 + 1;
    uVar2 = DigitValue(*pcVar1);
    if ((int)uVar2 < 0) {
      return false;
    }
    uVar3 = (ulong)*i + (int)uVar2 * _digit_value;
    if (0x40000000 < uVar3) {
      return false;
    }
    *i = (uint32_t)uVar3;
    if (bias + 1 < new_i._4_4_) {
      if (new_i._4_4_ < bias + 0x1a) {
        local_4c = new_i._4_4_ - bias;
      }
      else {
        local_4c = 0x1a;
      }
    }
    else {
      local_4c = 1;
    }
    if (uVar2 < local_4c) break;
    _digit_value = (ulong)(0x24 - local_4c) * _digit_value;
    new_i._4_4_ = new_i._4_4_ + 0x24;
  }
  return true;
}

Assistant:

bool ScanNextDelta(const char*& punycode_begin, const char* const punycode_end,
                   uint32_t bias, uint32_t& i) {
  uint64_t w = 1;  // 64 bits to prevent overflow in w *= kBase - t

  // "for k = base to infinity in steps of base do begin ... end" in RFC 3492
  // section 6.2.  Each loop iteration scans one digit of the delta.
  for (uint32_t k = kBase; punycode_begin != punycode_end; k += kBase) {
    const int digit_value = DigitValue(*punycode_begin++);
    if (digit_value < 0) return false;

    // Compute this in 64-bit arithmetic so we can check for overflow afterward.
    const uint64_t new_i = i + static_cast<uint64_t>(digit_value) * w;

    // Valid deltas are bounded by (#chars already emitted) * kMaxCodePoint, but
    // invalid input could encode an arbitrarily large delta.  Nip that in the
    // bud here.
    static_assert(
        kMaxI >= kMaxChars * kMaxCodePoint,
        "kMaxI is too small to prevent spurious failures on good input");
    if (new_i > kMaxI) return false;

    static_assert(
        kMaxI < (uint64_t{1} << 32),
        "Make kMaxI smaller or i 64 bits wide to prevent silent wraparound");
    i = static_cast<uint32_t>(new_i);

    // Compute the threshold that determines whether this is the last digit and
    // (if not) what the next digit's place value will be.  This logic from RFC
    // 3492 section 6.2 is explained in section 3.3.
    uint32_t t;
    if (k <= bias + kTMin) {
      t = kTMin;
    } else if (k >= bias + kTMax) {
      t = kTMax;
    } else {
      t = k - bias;
    }
    if (static_cast<uint32_t>(digit_value) < t) return true;

    // If this gets too large, the range check on new_i in the next iteration
    // will catch it.  We know this multiplication will not overwrap because w
    // is 64 bits wide.
    w *= kBase - t;
  }
  return false;
}